

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O0

bool ON_CRT_LOCALE::Validate_sprintf(void)

{
  bool bVar1;
  int printf_rc_00;
  char local_48 [4];
  int printf_rc;
  char buffer [64];
  
  memset(local_48,0,0x40);
  printf_rc_00 = sprintf(local_48,m_validation_print_format,0x42a674e79c5fe480);
  bVar1 = ValidateString(local_48,0x40,printf_rc_00);
  return bVar1;
}

Assistant:

static bool Validate_sprintf()
  {
    // Test formatted printing
    char buffer[64] = { 0 };
    // Testing C-runtime - do not using ON_String::FormatIntoBuffer
    int printf_rc = sprintf(buffer, m_validation_print_format, m_validation_value);
    return ValidateString(buffer, sizeof(buffer), printf_rc);
  }